

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

OPJ_BOOL opj_j2k_start_compress
                   (opj_j2k_t *p_j2k,opj_stream_private_t *p_stream,opj_image_t *p_image,
                   opj_event_mgr_t *p_manager)

{
  OPJ_BOOL OVar1;
  opj_image_t *poVar2;
  uint local_34;
  OPJ_UINT32 it_comp;
  opj_event_mgr_t *p_manager_local;
  opj_image_t *p_image_local;
  opj_stream_private_t *p_stream_local;
  opj_j2k_t *p_j2k_local;
  
  if (p_j2k == (opj_j2k_t *)0x0) {
    __assert_fail("p_j2k != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x2c60,
                  "OPJ_BOOL opj_j2k_start_compress(opj_j2k_t *, opj_stream_private_t *, opj_image_t *, opj_event_mgr_t *)"
                 );
  }
  if (p_stream == (opj_stream_private_t *)0x0) {
    __assert_fail("p_stream != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x2c61,
                  "OPJ_BOOL opj_j2k_start_compress(opj_j2k_t *, opj_stream_private_t *, opj_image_t *, opj_event_mgr_t *)"
                 );
  }
  if (p_manager == (opj_event_mgr_t *)0x0) {
    __assert_fail("p_manager != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x2c62,
                  "OPJ_BOOL opj_j2k_start_compress(opj_j2k_t *, opj_stream_private_t *, opj_image_t *, opj_event_mgr_t *)"
                 );
  }
  poVar2 = opj_image_create0();
  p_j2k->m_private_image = poVar2;
  if (p_j2k->m_private_image == (opj_image_t *)0x0) {
    opj_event_msg(p_manager,1,"Failed to allocate image header.");
    p_j2k_local._4_4_ = 0;
  }
  else {
    opj_copy_image_header(p_image,p_j2k->m_private_image);
    if (p_image->comps != (opj_image_comp_t *)0x0) {
      for (local_34 = 0; local_34 < p_image->numcomps; local_34 = local_34 + 1) {
        if (p_image->comps[local_34].data != (OPJ_INT32 *)0x0) {
          p_j2k->m_private_image->comps[local_34].data = p_image->comps[local_34].data;
          p_image->comps[local_34].data = (OPJ_INT32 *)0x0;
        }
      }
    }
    OVar1 = opj_j2k_setup_encoding_validation(p_j2k,p_manager);
    if (OVar1 == 0) {
      p_j2k_local._4_4_ = 0;
    }
    else {
      OVar1 = opj_j2k_exec(p_j2k,p_j2k->m_validation_list,p_stream,p_manager);
      if (OVar1 == 0) {
        p_j2k_local._4_4_ = 0;
      }
      else {
        OVar1 = opj_j2k_setup_header_writing(p_j2k,p_manager);
        if (OVar1 == 0) {
          p_j2k_local._4_4_ = 0;
        }
        else {
          OVar1 = opj_j2k_exec(p_j2k,p_j2k->m_procedure_list,p_stream,p_manager);
          if (OVar1 == 0) {
            p_j2k_local._4_4_ = 0;
          }
          else {
            p_j2k_local._4_4_ = 1;
          }
        }
      }
    }
  }
  return p_j2k_local._4_4_;
}

Assistant:

OPJ_BOOL opj_j2k_start_compress(opj_j2k_t *p_j2k,
                                opj_stream_private_t *p_stream,
                                opj_image_t * p_image,
                                opj_event_mgr_t * p_manager)
{
    /* preconditions */
    assert(p_j2k != 00);
    assert(p_stream != 00);
    assert(p_manager != 00);

    p_j2k->m_private_image = opj_image_create0();
    if (! p_j2k->m_private_image) {
        opj_event_msg(p_manager, EVT_ERROR, "Failed to allocate image header.");
        return OPJ_FALSE;
    }
    opj_copy_image_header(p_image, p_j2k->m_private_image);

    /* TODO_MSD: Find a better way */
    if (p_image->comps) {
        OPJ_UINT32 it_comp;
        for (it_comp = 0 ; it_comp < p_image->numcomps; it_comp++) {
            if (p_image->comps[it_comp].data) {
                p_j2k->m_private_image->comps[it_comp].data = p_image->comps[it_comp].data;
                p_image->comps[it_comp].data = NULL;

            }
        }
    }

    /* customization of the validation */
    if (! opj_j2k_setup_encoding_validation(p_j2k, p_manager)) {
        return OPJ_FALSE;
    }

    /* validation of the parameters codec */
    if (! opj_j2k_exec(p_j2k, p_j2k->m_validation_list, p_stream, p_manager)) {
        return OPJ_FALSE;
    }

    /* customization of the encoding */
    if (! opj_j2k_setup_header_writing(p_j2k, p_manager)) {
        return OPJ_FALSE;
    }

    /* write header */
    if (! opj_j2k_exec(p_j2k, p_j2k->m_procedure_list, p_stream, p_manager)) {
        return OPJ_FALSE;
    }

    return OPJ_TRUE;
}